

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

string * __thiscall
helics::ValueFederateManager::localQuery_abi_cxx11_
          (string *__return_storage_ptr__,ValueFederateManager *this,string_view queryStr)

{
  DataType DVar1;
  long lVar2;
  _func_int *p_Var3;
  pointer pcVar4;
  string *this_00;
  uint uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  _Base_ptr p_Var11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Publication **ppPVar12;
  string *psVar13;
  char *__s1;
  size_t __n;
  uint __len;
  Publication **ppPVar14;
  uint __val;
  Input **ppIVar15;
  ulong uVar16;
  unique_lock<std::mutex> *this_01;
  ulong uVar17;
  _Rb_tree_header *p_Var18;
  Input *inp;
  Input *pIVar19;
  size_type __rlen;
  double val;
  JsonBuilder JB;
  json V;
  Input inpTemp;
  Input **local_1e8;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  string *local_1a0;
  shared_handle local_198;
  pthread_rwlock_t *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  data local_170;
  undefined1 local_160 [80];
  DataType local_110;
  
  __s1 = queryStr._M_str;
  __n = queryStr._M_len;
  local_178 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_178;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1a0 = __return_storage_ptr__;
  switch(__n - 6) {
  case 0:
    iVar7 = bcmp(__s1,"inputs",__n);
    if (iVar7 != 0) {
      switch(__n - 6) {
      case 0:
        goto switchD_001fe094_caseD_0;
      case 1:
        goto switchD_001fe064_caseD_1;
      case 2:
      case 3:
      case 4:
      case 5:
        goto switchD_001fe064_caseD_2;
      case 6:
        goto switchD_001fe064_caseD_6;
      case 7:
        goto switchD_001fe064_caseD_7;
      default:
        goto switchD_001fe064_default;
      }
    }
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock_shared(&local_198,&this->inputs);
    local_1c0._0_8_ = &local_1b0;
    local_1b0._M_allocated_capacity._0_2_ = 0x5b;
    local_1c0._8_8_ = (mutex_type *)0x1;
    if (((local_198.data)->dataStorage).csize == 0) {
      uVar17 = (ulong)((local_198.data)->dataStorage).bsize;
      ppIVar15 = ((local_198.data)->dataStorage).dataptr;
      if (uVar17 == 0x20) {
        if (ppIVar15 == (Input **)0x0) {
          ppIVar15 = &gmlc::containers::
                      StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                      emptyValue;
        }
        else {
          ppIVar15 = ppIVar15 + (long)((local_198.data)->dataStorage).dataSlotIndex + 1;
        }
        goto LAB_001feb75;
      }
      ppIVar15 = ppIVar15 + ((local_198.data)->dataStorage).dataSlotIndex;
      pIVar19 = *ppIVar15 + uVar17;
    }
    else {
      ppIVar15 = ((local_198.data)->dataStorage).dataptr;
LAB_001feb75:
      pIVar19 = *ppIVar15;
      uVar17 = 0;
    }
    iVar7 = ((local_198.data)->dataStorage).bsize;
    local_1e8 = ((local_198.data)->dataStorage).dataptr;
    if (iVar7 == 0x20) {
      if (local_1e8 == (Input **)0x0) {
        local_1e8 = &gmlc::containers::
                     StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                     emptyValue;
      }
      else {
        local_1e8 = local_1e8 + (long)((local_198.data)->dataStorage).dataSlotIndex + 1;
      }
      iVar7 = 0;
    }
    else {
      local_1e8 = local_1e8 + ((local_198.data)->dataStorage).dataSlotIndex;
    }
    if (((int)uVar17 != iVar7) || (ppIVar15 != local_1e8)) {
      do {
        psVar13 = Interface::getName_abi_cxx11_(&pIVar19->super_Interface);
        if (psVar13->_M_string_length != 0) {
          psVar13 = Interface::getName_abi_cxx11_(&pIVar19->super_Interface);
          local_1e0._0_8_ = &local_1d0;
          pcVar4 = (psVar13->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1e0,pcVar4,pcVar4 + psVar13->_M_string_length);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0)
          ;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump((string_t *)local_160,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_170,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_170);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                    (char *)local_160._0_8_,local_160._8_8_);
          if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
            operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._0_8_ != &local_1d0) {
            operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                    ',');
        }
        iVar9 = (int)uVar17;
        uVar17 = (ulong)(iVar9 + 1U);
        if (iVar9 < 0x1f) {
          pIVar19 = pIVar19 + 1;
        }
        else {
          ppIVar15 = ppIVar15 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
          uVar17 = (ulong)(iVar9 + 1U & 0x1f);
          pIVar19 = *ppIVar15 + uVar17;
        }
      } while (((int)uVar17 != iVar7) || (ppIVar15 != local_1e8));
    }
    if ((ulong)local_1c0._8_8_ < (mutex_type *)0x2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,']');
      break;
    }
LAB_001ff089:
    ((char *)(local_1c0._0_8_ + -1))[local_1c0._8_8_] = ']';
    break;
  case 1:
switchD_001fe064_caseD_1:
    iVar7 = bcmp(__s1,"updates",__n);
    if (iVar7 == 0) {
      fileops::JsonBuilder::JsonBuilder((JsonBuilder *)&local_198);
      gmlc::libguarded::
      shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
      ::lock_shared((shared_handle *)local_1c0,&this->inputs);
      if (*(size_type *)local_1c0._0_8_ == 0) {
        uVar17 = (ulong)(int)*(long *)(local_1c0._0_8_ + 0x18);
        lVar2 = *(long *)(local_1c0._0_8_ + 8);
        if (uVar17 == 0x20) {
          if (lVar2 == 0) {
            ppIVar15 = &gmlc::containers::
                        StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                        emptyValue;
          }
          else {
            ppIVar15 = (Input **)(lVar2 + (long)*(int *)(local_1c0._0_8_ + 0x14) * 8 + 8);
          }
          goto LAB_001fe580;
        }
        ppIVar15 = (Input **)(lVar2 + (long)*(int *)(local_1c0._0_8_ + 0x14) * 8);
        pIVar19 = *ppIVar15 + uVar17;
      }
      else {
        ppIVar15 = *(Input ***)(local_1c0._0_8_ + 8);
LAB_001fe580:
        pIVar19 = *ppIVar15;
        uVar17 = 0;
      }
      iVar7 = (int)*(long *)(local_1c0._0_8_ + 0x18);
      lVar2 = *(long *)(local_1c0._0_8_ + 8);
      if (iVar7 == 0x20) {
        if (lVar2 == 0) {
          local_1e8 = &gmlc::containers::
                       StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                       emptyValue;
        }
        else {
          local_1e8 = (Input **)(lVar2 + (long)*(int *)(local_1c0._0_8_ + 0x14) * 8 + 8);
        }
        iVar7 = 0;
      }
      else {
        local_1e8 = (Input **)(lVar2 + (long)*(int *)(local_1c0._0_8_ + 0x14) * 8);
      }
      while ((iVar9 = (int)uVar17, iVar9 != iVar7 || (ppIVar15 != local_1e8))) {
        bVar6 = Input::isUpdated(pIVar19);
        if (bVar6) {
          Input::Input((Input *)local_160,pIVar19);
          if ((local_110 == HELICS_ANY) || (DVar1 = local_110, local_110 == HELICS_UNKNOWN)) {
            DVar1 = pIVar19->injectionType;
          }
          p_Var3 = (pIVar19->super_Interface)._vptr_Interface[4];
          if (DVar1 == HELICS_VECTOR) {
            iVar10 = (*p_Var3)(pIVar19);
            Input::getValue_impl<std::vector<double,std::allocator<double>>>
                      ((vector<double,_std::allocator<double>_> *)local_1e0,(Input *)local_160);
            fileops::JsonBuilder::addElement
                      ((JsonBuilder *)&local_198,(string *)CONCAT44(extraout_var_03,iVar10),
                       (vector<double,_std::allocator<double>_> *)local_1e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              uVar17 = local_1d0._M_allocated_capacity - local_1e0._0_8_;
LAB_001feabb:
              operator_delete((void *)local_1e0._0_8_,uVar17);
            }
          }
          else if (DVar1 == HELICS_DOUBLE) {
            iVar10 = (*p_Var3)(pIVar19);
            Input::getValue_impl<double>((Input *)local_160,local_1e0);
            fileops::JsonBuilder::addElement
                      ((JsonBuilder *)&local_198,(string *)CONCAT44(extraout_var_02,iVar10),
                       (double)local_1e0._0_8_);
          }
          else {
            iVar10 = (*p_Var3)(pIVar19);
            Input::getValue_impl<std::__cxx11::string>((string *)local_1e0,(Input *)local_160);
            fileops::JsonBuilder::addElement
                      ((JsonBuilder *)&local_198,(string *)CONCAT44(extraout_var_04,iVar10),
                       (string *)local_1e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._0_8_ != &local_1d0) {
              uVar17 = local_1d0._M_allocated_capacity + 1;
              goto LAB_001feabb;
            }
          }
          Input::~Input((Input *)local_160);
        }
        uVar17 = (ulong)(iVar9 + 1U);
        if (iVar9 < 0x1f) {
          pIVar19 = pIVar19 + 1;
        }
        else {
          ppIVar15 = ppIVar15 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
          uVar17 = (ulong)(iVar9 + 1U & 0x1f);
          pIVar19 = *ppIVar15 + uVar17;
        }
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_1c0 + 8));
      fileops::JsonBuilder::generate_abi_cxx11_((string *)local_160,(JsonBuilder *)&local_198);
      goto LAB_001feb2d;
    }
    if (__n != 6) {
      return local_1a0;
    }
    goto switchD_001fe094_caseD_0;
  case 2:
  case 3:
  case 4:
  case 5:
    goto switchD_001fe064_caseD_2;
  case 6:
switchD_001fe064_caseD_6:
    iVar7 = bcmp(__s1,"publications",__n);
    if (iVar7 != 0) {
      if ((long)__n < 0xd) goto LAB_001fe14a;
      if (__n == 0x15) goto LAB_001fe100;
      if (__n != 0x13) {
        if (__n != 0xd) {
          return local_1a0;
        }
        goto switchD_001fe064_caseD_7;
      }
      goto LAB_001fe130;
    }
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock_shared((shared_handle *)&local_198,&this->publications);
    local_1c0._0_8_ = &local_1b0;
    local_1b0._M_allocated_capacity._0_2_ = 0x5b;
    local_1c0._8_8_ = (mutex_type *)0x1;
    if (((local_198.data)->dataStorage).csize == 0) {
      uVar17 = (ulong)((local_198.data)->dataStorage).bsize;
      ppIVar15 = ((local_198.data)->dataStorage).dataptr;
      if (uVar17 == 0x20) {
        if (ppIVar15 == (Input **)0x0) {
          ppPVar14 = &gmlc::containers::
                      StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>
                      ::end::emptyValue;
        }
        else {
          ppPVar14 = (Publication **)
                     (ppIVar15 + (long)((local_198.data)->dataStorage).dataSlotIndex + 1);
        }
        goto LAB_001fe958;
      }
      ppPVar14 = (Publication **)(ppIVar15 + ((local_198.data)->dataStorage).dataSlotIndex);
      pIVar19 = (Input *)((long)&((Input *)*ppPVar14)->super_Interface + uVar17 * 200);
    }
    else {
      ppPVar14 = (Publication **)((local_198.data)->dataStorage).dataptr;
LAB_001fe958:
      pIVar19 = (Input *)*ppPVar14;
      uVar17 = 0;
    }
    iVar7 = ((local_198.data)->dataStorage).bsize;
    local_1e8 = ((local_198.data)->dataStorage).dataptr;
    if (iVar7 == 0x20) {
      if (local_1e8 == (Input **)0x0) {
        ppPVar12 = &gmlc::containers::
                    StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>
                    ::end::emptyValue;
      }
      else {
        ppPVar12 = (Publication **)
                   (local_1e8 + (long)((local_198.data)->dataStorage).dataSlotIndex + 1);
      }
      iVar7 = 0;
      local_1e8 = (Input **)ppPVar12;
    }
    else {
      local_1e8 = local_1e8 + ((local_198.data)->dataStorage).dataSlotIndex;
    }
    if (((int)uVar17 != iVar7) || ((Input **)ppPVar14 != local_1e8)) {
      do {
        psVar13 = Interface::getName_abi_cxx11_(&pIVar19->super_Interface);
        if (psVar13->_M_string_length != 0) {
          psVar13 = Interface::getName_abi_cxx11_(&pIVar19->super_Interface);
          local_1e0._0_8_ = &local_1d0;
          pcVar4 = (psVar13->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1e0,pcVar4,pcVar4 + psVar13->_M_string_length);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0)
          ;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump((string_t *)local_160,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_170,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_170);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                    (char *)local_160._0_8_,local_160._8_8_);
          if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
            operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._0_8_ != &local_1d0) {
            operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                    ',');
        }
        iVar9 = (int)uVar17;
        uVar17 = (ulong)(iVar9 + 1U);
        if (iVar9 < 0x1f) {
          pIVar19 = (Input *)&(pIVar19->sourceTypes).
                              super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ppPVar14 = (Publication **)((Input **)ppPVar14 + (ulong)(iVar9 - 0x1fU >> 5) + 1);
          uVar17 = (ulong)(iVar9 + 1U & 0x1f);
          pIVar19 = (Input *)((long)&((Input *)*ppPVar14)->super_Interface + uVar17 * 200);
        }
      } while (((int)uVar17 != iVar7) || ((Input **)ppPVar14 != local_1e8));
    }
    if ((mutex_type *)0x1 < (ulong)local_1c0._8_8_) goto LAB_001ff089;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,']');
    break;
  case 7:
switchD_001fe064_caseD_7:
    iVar7 = bcmp(__s1,"subscriptions",__n);
    if (iVar7 == 0) {
      bVar6 = (this->targetIDs).enabled;
      if (bVar6 == true) {
        local_180 = (pthread_rwlock_t *)&(this->targetIDs).m_mutex;
        std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_180->__data);
      }
      else {
        local_180 = (pthread_rwlock_t *)0x0;
      }
      local_1c0._0_8_ = &local_1b0;
      local_1b0._M_allocated_capacity._0_2_ = 0x5b;
      local_1c0._8_8_ = (mutex_type *)0x1;
      p_Var11 = (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var18 = &(this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var11 != p_Var18) {
        do {
          local_1e0._0_8_ = &local_1d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1e0,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0)
          ;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump((string_t *)local_160,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_198,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_198);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                    (char *)local_160._0_8_,local_160._8_8_);
          if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
            operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._0_8_ != &local_1d0) {
            operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                    ',');
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var18);
      }
      if ((ulong)local_1c0._8_8_ < (mutex_type *)0x2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,']'
                 );
      }
      else {
        ((char *)(local_1c0._0_8_ + -1))[local_1c0._8_8_] = ']';
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(local_1a0,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._0_8_ != &local_1b0) {
        operator_delete((void *)local_1c0._0_8_,
                        CONCAT62(local_1b0._M_allocated_capacity._2_6_,
                                 local_1b0._M_allocated_capacity._0_2_) + 1);
      }
      if (bVar6 == false) {
        return local_1a0;
      }
      pthread_rwlock_unlock(local_180);
      return local_1a0;
    }
    if (0x12 < (long)__n) goto switchD_001fe064_default;
LAB_001fe14a:
    if (__n != 6) {
      if (__n != 7) {
        return local_1a0;
      }
      goto switchD_001fe064_caseD_1;
    }
switchD_001fe094_caseD_0:
    iVar7 = bcmp(__s1,"values",__n);
    if (iVar7 != 0) {
      return local_1a0;
    }
    fileops::JsonBuilder::JsonBuilder((JsonBuilder *)&local_198);
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock_shared((shared_handle *)local_1c0,&this->inputs);
    if (*(size_type *)local_1c0._0_8_ == 0) {
      uVar17 = (ulong)(int)*(long *)(local_1c0._0_8_ + 0x18);
      lVar2 = *(long *)(local_1c0._0_8_ + 8);
      if (uVar17 == 0x20) {
        if (lVar2 == 0) {
          ppIVar15 = &gmlc::containers::
                      StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                      emptyValue;
        }
        else {
          ppIVar15 = (Input **)(lVar2 + (long)*(int *)(local_1c0._0_8_ + 0x14) * 8 + 8);
        }
        goto LAB_001fe50b;
      }
      ppIVar15 = (Input **)(lVar2 + (long)*(int *)(local_1c0._0_8_ + 0x14) * 8);
      pIVar19 = *ppIVar15 + uVar17;
    }
    else {
      ppIVar15 = *(Input ***)(local_1c0._0_8_ + 8);
LAB_001fe50b:
      pIVar19 = *ppIVar15;
      uVar17 = 0;
    }
    iVar7 = (int)*(long *)(local_1c0._0_8_ + 0x18);
    lVar2 = *(long *)(local_1c0._0_8_ + 8);
    if (iVar7 == 0x20) {
      if (lVar2 == 0) {
        local_180 = (pthread_rwlock_t *)
                    &gmlc::containers::
                     StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                     emptyValue;
      }
      else {
        local_180 = (pthread_rwlock_t *)(lVar2 + (long)*(int *)(local_1c0._0_8_ + 0x14) * 8 + 8);
      }
      iVar7 = 0;
    }
    else {
      local_180 = (pthread_rwlock_t *)(lVar2 + (long)*(int *)(local_1c0._0_8_ + 0x14) * 8);
    }
    if (((int)uVar17 != iVar7) || ((pthread_rwlock_t *)ppIVar15 != local_180)) {
      do {
        Input::Input((Input *)local_160,pIVar19);
        Input::checkUpdate((Input *)local_160,true);
        if ((local_110 == HELICS_ANY) || (DVar1 = local_110, local_110 == HELICS_UNKNOWN)) {
          DVar1 = pIVar19->injectionType;
        }
        p_Var3 = (pIVar19->super_Interface)._vptr_Interface[4];
        if (DVar1 == HELICS_VECTOR) {
          iVar9 = (*p_Var3)(pIVar19);
          Input::getValue_impl<std::vector<double,std::allocator<double>>>
                    ((vector<double,_std::allocator<double>_> *)local_1e0,(Input *)local_160);
          fileops::JsonBuilder::addElement
                    ((JsonBuilder *)&local_198,(string *)CONCAT44(extraout_var_00,iVar9),
                     (vector<double,_std::allocator<double>_> *)local_1e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            uVar16 = local_1d0._M_allocated_capacity - local_1e0._0_8_;
LAB_001fe8e1:
            operator_delete((void *)local_1e0._0_8_,uVar16);
          }
        }
        else if (DVar1 == HELICS_DOUBLE) {
          iVar9 = (*p_Var3)(pIVar19);
          Input::getValue_impl<double>((Input *)local_160,local_1e0);
          fileops::JsonBuilder::addElement
                    ((JsonBuilder *)&local_198,(string *)CONCAT44(extraout_var,iVar9),
                     (double)local_1e0._0_8_);
        }
        else {
          iVar9 = (*p_Var3)(pIVar19);
          Input::getValue_impl<std::__cxx11::string>((string *)local_1e0,(Input *)local_160);
          fileops::JsonBuilder::addElement
                    ((JsonBuilder *)&local_198,(string *)CONCAT44(extraout_var_01,iVar9),
                     (string *)local_1e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._0_8_ != &local_1d0) {
            uVar16 = local_1d0._M_allocated_capacity + 1;
            goto LAB_001fe8e1;
          }
        }
        Input::~Input((Input *)local_160);
        iVar9 = (int)uVar17;
        uVar17 = (ulong)(iVar9 + 1U);
        if (iVar9 < 0x1f) {
          pIVar19 = pIVar19 + 1;
        }
        else {
          ppIVar15 = ppIVar15 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
          uVar17 = (ulong)(iVar9 + 1U & 0x1f);
          pIVar19 = *ppIVar15 + uVar17;
        }
      } while (((int)uVar17 != iVar7) || ((pthread_rwlock_t *)ppIVar15 != local_180));
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_1c0 + 8));
    fileops::JsonBuilder::generate_abi_cxx11_((string *)local_160,(JsonBuilder *)&local_198);
LAB_001feb2d:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    fileops::JsonBuilder::~JsonBuilder((JsonBuilder *)&local_198);
    return local_1a0;
  default:
switchD_001fe064_default:
    if (__n == 0x13) {
LAB_001fe130:
      iVar7 = bcmp(__s1,"updated_input_names",__n);
      if (iVar7 != 0) goto LAB_001fe14a;
      gmlc::libguarded::
      shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
      ::lock_shared(&local_198,&this->inputs);
      local_1c0._0_8_ = &local_1b0;
      local_1b0._M_allocated_capacity._0_2_ = 0x5b;
      local_1c0._8_8_ = (mutex_type *)0x1;
      if (((local_198.data)->dataStorage).csize == 0) {
        uVar17 = (ulong)((local_198.data)->dataStorage).bsize;
        ppIVar15 = ((local_198.data)->dataStorage).dataptr;
        if (uVar17 == 0x20) {
          if (ppIVar15 == (Input **)0x0) {
            ppIVar15 = &gmlc::containers::
                        StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                        emptyValue;
          }
          else {
            ppIVar15 = ppIVar15 + (long)((local_198.data)->dataStorage).dataSlotIndex + 1;
          }
          goto LAB_001fe603;
        }
        ppIVar15 = ppIVar15 + ((local_198.data)->dataStorage).dataSlotIndex;
        pIVar19 = *ppIVar15 + uVar17;
      }
      else {
        ppIVar15 = ((local_198.data)->dataStorage).dataptr;
LAB_001fe603:
        pIVar19 = *ppIVar15;
        uVar17 = 0;
      }
      iVar7 = ((local_198.data)->dataStorage).bsize;
      local_1e8 = ((local_198.data)->dataStorage).dataptr;
      if (iVar7 == 0x20) {
        if (local_1e8 == (Input **)0x0) {
          local_1e8 = &gmlc::containers::
                       StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                       emptyValue;
        }
        else {
          local_1e8 = local_1e8 + (long)((local_198.data)->dataStorage).dataSlotIndex + 1;
        }
        iVar7 = 0;
      }
      else {
        local_1e8 = local_1e8 + ((local_198.data)->dataStorage).dataSlotIndex;
      }
      if (((int)uVar17 != iVar7) || (ppIVar15 != local_1e8)) {
        do {
          bVar6 = Input::isUpdated(pIVar19);
          if (bVar6) {
            iVar9 = (*(pIVar19->super_Interface)._vptr_Interface[4])(pIVar19);
            local_1e0._0_8_ = &local_1d0;
            lVar2 = *(long *)CONCAT44(extraout_var_05,iVar9);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1e0,lVar2,
                       ((long *)CONCAT44(extraout_var_05,iVar9))[1] + lVar2);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump((string_t *)local_160,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_170,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_170);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0
                      ,(char *)local_160._0_8_,local_160._8_8_);
            if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
              operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._0_8_ != &local_1d0) {
              operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0
                      ,',');
          }
          iVar9 = (int)uVar17;
          uVar17 = (ulong)(iVar9 + 1U);
          if (iVar9 < 0x1f) {
            pIVar19 = pIVar19 + 1;
          }
          else {
            ppIVar15 = ppIVar15 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
            uVar17 = (ulong)(iVar9 + 1U & 0x1f);
            pIVar19 = *ppIVar15 + uVar17;
          }
        } while (((int)uVar17 != iVar7) || (ppIVar15 != local_1e8));
      }
      if ((mutex_type *)0x1 < (ulong)local_1c0._8_8_) goto LAB_001ff089;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,']');
      break;
    }
    if (__n != 0x15) {
      return local_1a0;
    }
LAB_001fe100:
    iVar7 = bcmp(__s1,"updated_input_indices",__n);
    if (iVar7 != 0) {
      if (__n == 6) goto switchD_001fe094_caseD_0;
      if (__n == 7) goto switchD_001fe064_caseD_1;
      if (__n != 0x13) {
        return local_1a0;
      }
      goto LAB_001fe130;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (local_1a0,0,0,"[",1);
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock((shared_handle *)local_1e0,&this->inputs);
    if (*(size_type *)local_1e0._0_8_ == 0) {
      uVar17 = (ulong)(int)*(long *)(local_1e0._0_8_ + 0x18);
      lVar2 = *(long *)(local_1e0._0_8_ + 8);
      if (uVar17 == 0x20) {
        if (lVar2 == 0) {
          ppIVar15 = &gmlc::containers::
                      StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                      emptyValue;
        }
        else {
          ppIVar15 = (Input **)(lVar2 + ((long)*(int *)(local_1e0._0_8_ + 0x14) + 1) * 8);
        }
        goto LAB_001fe22e;
      }
      ppIVar15 = (Input **)(lVar2 + (long)*(int *)(local_1e0._0_8_ + 0x14) * 8);
      pIVar19 = *ppIVar15 + uVar17;
    }
    else {
      ppIVar15 = *(Input ***)(local_1e0._0_8_ + 8);
LAB_001fe22e:
      pIVar19 = *ppIVar15;
      uVar17 = 0;
    }
    iVar7 = (int)*(long *)(local_1e0._0_8_ + 0x18);
    lVar2 = *(long *)(local_1e0._0_8_ + 8);
    if (iVar7 == 0x20) {
      if (lVar2 == 0) {
        local_1e8 = &gmlc::containers::
                     StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                     emptyValue;
      }
      else {
        local_1e8 = (Input **)(lVar2 + ((long)*(int *)(local_1e0._0_8_ + 0x14) + 1) * 8);
      }
      iVar7 = 0;
    }
    else {
      local_1e8 = (Input **)(lVar2 + (long)*(int *)(local_1e0._0_8_ + 0x14) * 8);
    }
    if (((int)uVar17 != iVar7) || (ppIVar15 != local_1e8)) {
      __val = 0;
      do {
        bVar6 = Input::isUpdated(pIVar19);
        if (bVar6) {
          __len = 1;
          if (9 < __val) {
            uVar16 = (ulong)__val;
            uVar5 = 4;
            do {
              __len = uVar5;
              uVar8 = (uint)uVar16;
              if (uVar8 < 100) {
                __len = __len - 2;
                goto LAB_001fe362;
              }
              if (uVar8 < 1000) {
                __len = __len - 1;
                goto LAB_001fe362;
              }
              if (uVar8 < 10000) goto LAB_001fe362;
              uVar16 = uVar16 / 10000;
              uVar5 = __len + 4;
            } while (99999 < uVar8);
            __len = __len + 1;
          }
LAB_001fe362:
          local_160._0_8_ = local_160 + 0x10;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160,(ulong)__len,'-');
          CLI::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_160._0_8_,__len,__val);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append(local_1a0,(char *)local_160._0_8_,local_160._8_8_);
          if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
            operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(local_1a0,',');
        }
        iVar9 = (int)uVar17;
        uVar17 = (ulong)(iVar9 + 1U);
        if (iVar9 < 0x1f) {
          pIVar19 = pIVar19 + 1;
        }
        else {
          ppIVar15 = ppIVar15 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
          uVar17 = (ulong)(iVar9 + 1U & 0x1f);
          pIVar19 = *ppIVar15 + uVar17;
        }
        __val = __val + 1;
      } while (((int)uVar17 != iVar7) || (ppIVar15 != local_1e8));
    }
    this_00 = local_1a0;
    if ((local_1a0->_M_dataplus)._M_p[local_1a0->_M_string_length - 1] == ',') {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (local_1a0);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (this_00,']');
    this_01 = (unique_lock<std::mutex> *)(local_1e0 + 8);
    goto LAB_001ff0d5;
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_1a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,
                    CONCAT62(local_1b0._M_allocated_capacity._2_6_,
                             local_1b0._M_allocated_capacity._0_2_) + 1);
  }
  this_01 = &local_198.m_handle_lock;
LAB_001ff0d5:
  std::unique_lock<std::mutex>::~unique_lock(this_01);
switchD_001fe064_caseD_2:
  return local_1a0;
}

Assistant:

std::string ValueFederateManager::localQuery(std::string_view queryStr) const
{
    std::string ret;
    if (queryStr == "inputs") {
        ret = generateStringVector_if(
            inputs.lock_shared(),
            [](const auto& info) { return info.getName(); },
            [](const auto& info) { return (!info.getName().empty()); });
    } else if (queryStr == "publications") {
        ret = generateStringVector_if(
            publications.lock_shared(),
            [](const auto& info) { return info.getName(); },
            [](const auto& info) { return (!info.getName().empty()); });
    } else if (queryStr == "subscriptions") {
        ret = generateStringVector(targetIDs.lock_shared(),
                                   [](const auto& target) { return target.first; });
    } else if (queryStr == "updated_input_indices") {
        ret = "[";
        auto hand = inputs.lock();
        int ii = 0;
        for (const auto& inp : *hand) {
            if (inp.isUpdated()) {
                ret.append(std::to_string(ii));
                ret.push_back(',');
            }
            ++ii;
        }
        if (ret.back() == ',') {
            ret.pop_back();
        }
        ret.push_back(']');
    } else if (queryStr == "updated_input_names") {
        ret = generateStringVector_if(
            inputs.lock_shared(),
            [](const auto& inp) { return inp.getDisplayName(); },
            [](const auto& inp) { return (inp.isUpdated()); });
    } else if (queryStr == "updates") {
        fileops::JsonBuilder JB;
        for (const auto& inp : inputs.lock_shared()) {
            if (inp.isUpdated()) {
                auto inpTemp = inp;
                auto iType = inpTemp.getHelicsType();
                if (iType == DataType::HELICS_ANY || iType == DataType::HELICS_UNKNOWN) {
                    iType = inp.getHelicsInjectionType();
                }
                if (iType == DataType::HELICS_DOUBLE) {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<double>());
                } else if (iType == DataType::HELICS_VECTOR) {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::vector<double>>());
                } else {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::string>());
                }
            }
        }
        ret = JB.generate();
    } else if (queryStr == "values") {
        fileops::JsonBuilder JB;
        for (const auto& inp : inputs.lock_shared()) {
            auto inpTemp = inp;
            inpTemp.checkUpdate(true);
            auto iType = inpTemp.getHelicsType();
            if (iType == DataType::HELICS_ANY || iType == DataType::HELICS_UNKNOWN) {
                iType = inp.getHelicsInjectionType();
            }
            if (iType == DataType::HELICS_DOUBLE) {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<double>());
            } else if (iType == DataType::HELICS_VECTOR) {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::vector<double>>());
            } else {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::string>());
            }
        }
        ret = JB.generate();
    }
    return ret;
}